

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O0

void __thiscall iutest::TestEnv::Variable::~Variable(Variable *this)

{
  Variable *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_locale_ctype);
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->m_ostream_formatter);
  TestEventListeners::~TestEventListeners(&this->m_event_listeners);
  std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::~vector
            (&this->m_environment_list);
  std::__cxx11::string::~string((string *)&this->m_default_package_name);
  StateVariable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~StateVariable(&this->m_stream_result_to);
  std::__cxx11::string::~string((string *)&this->m_flagfile);
  std::__cxx11::string::~string((string *)&this->m_test_filter);
  StateVariable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~StateVariable(&this->m_output_option);
  return;
}

Assistant:

Variable()
            : m_random_seed(0)
            , m_current_random_seed(0)
            , m_before_origin_random_seed(0)
            , m_repeat_count(1)
            , m_testpartresult_reporter(NULL)
        {}